

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O0

void __thiscall
OpenMD::TetrahedralityHBMatrix::TetrahedralityHBMatrix
          (TetrahedralityHBMatrix *this,SimInfo *info,string *filename,string *sele,double rCut,
          double OOcut,double thetaCut,double OHcut,int nbins)

{
  bool bVar1;
  ostream *poVar2;
  StaticAnalyser *this_00;
  string *params_00;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  string paramString;
  stringstream params;
  uint i;
  string *in_stack_fffffffffffffcd8;
  StaticAnalyser *in_stack_fffffffffffffce0;
  SimInfo *in_stack_fffffffffffffce8;
  StaticAnalyser *in_stack_fffffffffffffcf0;
  size_type in_stack_fffffffffffffcf8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd10;
  SelectionEvaluator *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  SelectionEvaluator *in_stack_fffffffffffffd30;
  string local_288 [32];
  stringstream local_268 [16];
  ostream local_258 [48];
  SimInfo *in_stack_fffffffffffffdd8;
  SelectionEvaluator *in_stack_fffffffffffffde0;
  uint local_dc;
  string local_c0 [32];
  string local_a0 [39];
  allocator<char> local_79;
  SimInfo *in_stack_ffffffffffffff88;
  SelectionManager *in_stack_ffffffffffffff90;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0
             ,(uint)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  *in_RDI = &PTR__TetrahedralityHBMatrix_00560388;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),in_RCX);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  in_RDI[0xe1] = in_XMM0_Qa;
  in_RDI[0xe2] = in_XMM1_Qa;
  in_RDI[0xe3] = in_XMM2_Qa;
  in_RDI[0xe4] = in_XMM3_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1d6b78);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0x1d6b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator(&local_79);
  getPrefix((string *)in_stack_fffffffffffffce8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffd18);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcf0,
               (SelectionSet *)in_stack_fffffffffffffce8);
    SelectionSet::~SelectionSet((SelectionSet *)0x1d6ce8);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  for (local_dc = 0; local_dc < *(uint *)((long)in_RDI + 0x34); local_dc = local_dc + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 0xec),(ulong)local_dc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8);
  }
  in_RDI[0xe6] = 0;
  in_RDI[0xe7] = 0x3ff199999999999a;
  in_RDI[0xe8] = ((double)in_RDI[0xe7] - (double)in_RDI[0xe6]) /
                 (double)*(uint *)((long)in_RDI + 0x34);
  std::__cxx11::stringstream::stringstream(local_268);
  poVar2 = std::operator<<(local_258," rCut = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0xe1]);
  poVar2 = std::operator<<(poVar2,", OOcut = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0xe2]);
  poVar2 = std::operator<<(poVar2,", thetacut = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0xe3]);
  poVar2 = std::operator<<(poVar2,", OHcut = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_RDI[0xe4]);
  poVar2 = std::operator<<(poVar2,", nbins = ");
  this_00 = (StaticAnalyser *)std::ostream::operator<<(poVar2,*(uint *)((long)in_RDI + 0x34));
  params_00 = (string *)std::operator<<((ostream *)this_00,", deltaQ = ");
  std::ostream::operator<<(params_00,(double)in_RDI[0xe8]);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_00,params_00);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::stringstream::~stringstream(local_268);
  return;
}

Assistant:

TetrahedralityHBMatrix::TetrahedralityHBMatrix(
      SimInfo* info, const std::string& filename, const std::string& sele,
      double rCut, double OOcut, double thetaCut, double OHcut, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info), rCut_(rCut),
      OOCut_(OOcut), thetaCut_(thetaCut), OHCut_(OHcut) {
    setAnalysisType("Tetrahedrality HBond Matrix");
    setOutputName(getPrefix(filename) + ".hbq");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    Q_histogram_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      Q_histogram_[i].resize(nBins_);
    }

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;

    std::stringstream params;
    params << " rCut = " << rCut_ << ", OOcut = " << OOCut_
           << ", thetacut = " << thetaCut_ << ", OHcut = " << OHCut_
           << ", nbins = " << nBins_ << ", deltaQ = " << deltaQ_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }